

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O3

IntrinsicResult intrinsic_basename(Context *context,IntrinsicResult partialResult)

{
  TextOutputMethod *pp_Var1;
  long *plVar2;
  undefined4 *puVar3;
  char *__path;
  char *__s;
  size_t sVar4;
  anon_union_8_3_2f476f46_for_data aVar5;
  _func_int **__dest;
  TextOutputMethod __s_00;
  ulong __n;
  Value path;
  String pathStr;
  Value local_80;
  Value local_70;
  long *local_60;
  char local_58;
  undefined1 local_50 [16];
  Interpreter *local_40;
  anon_union_8_3_2f476f46_for_data local_38;
  
  local_58 = '\0';
  plVar2 = (long *)operator_new(0x30);
  plVar2[1] = 1;
  *plVar2 = (long)&PTR__StringStorage_001bf0d8;
  plVar2[3] = 5;
  plVar2[4] = -1;
  puVar3 = (undefined4 *)operator_new__(5);
  plVar2[2] = (long)puVar3;
  *(undefined1 *)(puVar3 + 1) = 0;
  *puVar3 = 0x68746170;
  local_60 = plVar2;
  MiniScript::Context::GetVar
            ((Context *)local_50,(String *)partialResult.rs,(LocalOnlyMode)&local_60);
  if ((local_60 != (long *)0x0) && (local_58 == '\0')) {
    plVar2 = local_60 + 1;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (**(code **)(*local_60 + 8))();
    }
    local_60 = (long *)0x0;
  }
  if (local_50[0] == 0) {
    local_70.type = MiniScript::Value::zero;
    local_70.noInvoke = DAT_001c12e1;
    local_70.localOnly = DAT_001c12e2;
    local_70.data.ref = DAT_001c12e8;
    if (DAT_001c12e8 != (RefCountedStorage *)0x0 && Temp < MiniScript::Value::zero) {
      DAT_001c12e8->refCount = DAT_001c12e8->refCount + 1;
    }
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    MiniScript::Value::operator=
              ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
               &local_70);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((Temp < local_70.type) && (local_70.data.ref != (RefCountedStorage *)0x0)) {
      plVar2 = &(local_70.data.ref)->refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*(local_70.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_70.data.number = 0.0;
    }
    goto LAB_00125c1b;
  }
  MiniScript::Value::ToString((Value *)&local_40,(Machine *)local_50);
  if (local_40 == (Interpreter *)0x0) {
    __s_00 = (TextOutputMethod)0x19c80e;
  }
  else {
    __s_00 = local_40->implicitOutput;
  }
  __path = strdup((char *)__s_00);
  __s = __xpg_basename(__path);
  if (__s == (char *)0x0) {
LAB_00125b60:
    aVar5.number = 0.0;
  }
  else {
    sVar4 = strlen(__s);
    if (sVar4 == 0) goto LAB_00125b60;
    aVar5.ref = (RefCountedStorage *)operator_new(0x30);
    __n = sVar4 + 1;
    (aVar5.ref)->refCount = 1;
    (aVar5.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
    aVar5.ref[1].refCount = __n;
    aVar5.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
    __dest = (_func_int **)operator_new__(__n);
    aVar5.ref[1]._vptr_RefCountedStorage = __dest;
    memcpy(__dest,__s,__n);
  }
  free(__path);
  local_80.type = String;
  local_80.noInvoke = false;
  local_80.localOnly = Off;
  local_80.data = aVar5;
  if (aVar5.ref == (RefCountedStorage *)0x0) {
    local_80.data = DAT_001c1308;
  }
  if (local_80.data.ref != (RefCountedStorage *)0x0) {
    (local_80.data.ref)->refCount = (local_80.data.ref)->refCount + 1;
  }
  (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
  MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
  MiniScript::Value::operator=
            ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
             &local_80);
  *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
  if ((Temp < local_80.type) && (local_80.data.ref != (RefCountedStorage *)0x0)) {
    plVar2 = &(local_80.data.ref)->refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*(local_80.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_80.data.number = 0.0;
  }
  if (aVar5.ref != (RefCountedStorage *)0x0) {
    plVar2 = &(aVar5.ref)->refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*(aVar5.ref)->_vptr_RefCountedStorage[1])(aVar5.number);
    }
  }
  if ((local_40 != (Interpreter *)0x0) && (local_38.tempNum._0_1_ == '\0')) {
    pp_Var1 = &local_40->standardOutput;
    *pp_Var1 = *pp_Var1 + -1;
    if (*pp_Var1 == (TextOutputMethod)0x0) {
      (*local_40->_vptr_Interpreter[1])();
    }
  }
LAB_00125c1b:
  if ((2 < local_50[0]) && ((long *)local_50._8_8_ != (long *)0x0)) {
    plVar2 = (long *)(local_50._8_8_ + 8);
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (**(code **)(*(long *)local_50._8_8_ + 8))();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_basename(Context *context, IntrinsicResult partialResult) {
	Value path = context->GetVar("path");
	if (path.IsNull()) return IntrinsicResult(Value::zero);
	String pathStr = path.ToString();
	#if _WIN32 || _WIN64
		char driveBuf[3];
		char nameBuf[256];
		char extBuf[256];
		_splitpath_s(pathStr.c_str(), driveBuf, sizeof(driveBuf), nullptr, 0, nameBuf, sizeof(nameBuf), extBuf, sizeof(extBuf));
		String result = String(nameBuf) + String(extBuf);
	#elif defined(__APPLE__) || defined(__FreeBSD__)
		String result(basename((char*)pathStr.c_str()));
	#else
		char *duplicate = strdup((char*)pathStr.c_str());
		String result(basename(duplicate));
		free(duplicate);
	#endif
	return IntrinsicResult(result);
}